

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O3

uint64_t helper_pcmpeqb_mips(uint64_t fs,uint64_t ft)

{
  return CONCAT17(-((char)(ft >> 0x38) == (char)(fs >> 0x38)),
                  CONCAT16(-((char)(ft >> 0x30) == (char)(fs >> 0x30)),
                           CONCAT15(-((char)(ft >> 0x28) == (char)(fs >> 0x28)),
                                    CONCAT14(-((char)(ft >> 0x20) == (char)(fs >> 0x20)),
                                             CONCAT13(-((char)(ft >> 0x18) == (char)(fs >> 0x18)),
                                                      CONCAT12(-((char)(ft >> 0x10) ==
                                                                (char)(fs >> 0x10)),
                                                               CONCAT11(-((char)(ft >> 8) ==
                                                                         (char)(fs >> 8)),
                                                                        -((char)ft == (char)fs))))))
                          ));
}

Assistant:

uint64_t helper_pcmpeqb(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 8; i++) {
        vs.ub[i] = -(vs.ub[i] == vt.ub[i]);
    }
    return vs.d;
}